

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBorderClampTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureBorderClampRangeClampCase::init
          (TextureBorderClampRangeClampCase *this,EVP_PKEY_CTX *ctx)

{
  vector<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TextureChannelClass TVar2;
  deUint32 dVar3;
  bool bVar4;
  int i;
  long lVar5;
  pointer pIVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  float fVar11;
  Vector<float,_4> res_3;
  IVec4 numBits;
  Vector<float,_4> res_2;
  IVec4 value;
  IterationConfig iteration;
  IVec4 minValue;
  TextureFormat texFormat;
  IVec4 divSafeRange;
  IVec4 maxValue;
  IVec4 valueRange;
  undefined8 local_148;
  undefined8 uStack_140;
  int local_138 [4];
  float local_128 [4];
  anon_union_16_3_1194ccdc_for_v local_118;
  value_type local_108;
  uint local_90;
  float fStack_8c;
  uint uStack_88;
  uint uStack_84;
  TextureFormat local_80;
  float afStack_78 [4];
  int local_68 [4];
  Vec4 local_58;
  int local_48 [6];
  
  TextureBorderClampTest::init(&this->super_TextureBorderClampTest,ctx);
  local_80 = tcu::getEffectiveDepthStencilTextureFormat
                       ((TextureFormat *)
                        &((this->super_TextureBorderClampTest).m_texture.
                          super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>.
                          m_data.ptr)->m_refTexture,
                        (this->super_TextureBorderClampTest).m_sampleMode);
  bVar4 = isDepthFormat((this->super_TextureBorderClampTest).m_texFormat,
                        (this->super_TextureBorderClampTest).m_sampleMode);
  TVar2 = (this->super_TextureBorderClampTest).m_channelClass;
  if (TVar2 == TEXTURECHANNELCLASS_FLOATING_POINT || bVar4) {
    paVar1 = &local_108.description.field_2;
    local_108.description._M_string_length = 0;
    local_108.description.field_2._M_local_buf[0] = '\0';
    local_108.p0.m_data[0] = -1.2;
    local_108.p0.m_data[1] = -3.0;
    local_108.p1.m_data[0] = 1.2;
    local_108.p1.m_data[1] = 2.5;
    lVar5 = 0;
    do {
      local_138[lVar5] = 0x7f800000;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    lVar5 = 0;
    do {
      local_138[lVar5] = 0x3f000000;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    lVar5 = 0;
    do {
      local_138[lVar5] = 0x3e800000;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    local_108.description._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_replace((ulong)&local_108.description,0,(char *)0x0,0x1c9dbd3);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
    ::push_back(&this->m_iterations,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108.description._M_dataplus._M_p != paVar1) {
      operator_delete(local_108.description._M_dataplus._M_p,
                      CONCAT71(local_108.description.field_2._M_allocated_capacity._1_7_,
                               local_108.description.field_2._M_local_buf[0]) + 1);
    }
    local_108.description._M_string_length = 0;
    local_108.description.field_2._M_local_buf[0] = '\0';
    local_108.p0.m_data[0] = -0.25;
    local_108.p0.m_data[1] = -0.75;
    local_108.p1.m_data[0] = 2.25;
    local_108.p1.m_data[1] = 1.25;
    lVar5 = 0;
    do {
      local_138[lVar5] = -0x800000;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    local_108.borderColor.v.uData[1] = local_138[1];
    local_108.borderColor.v.uData[0] = local_138[0];
    local_108.borderColor.v.uData[3] = local_138[3];
    local_108.borderColor.v.uData[2] = local_138[2];
    lVar5 = 0;
    do {
      local_138[lVar5] = 0x3f000000;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    local_108.lookupScale.m_data[1] = (float)local_138[1];
    local_108.lookupScale.m_data[0] = (float)local_138[0];
    local_108.lookupScale.m_data[3] = (float)local_138[3];
    local_108.lookupScale.m_data[2] = (float)local_138[2];
    lVar5 = 0;
    do {
      local_138[lVar5] = 0x3e800000;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    local_108.lookupBias.m_data[1] = (float)local_138[1];
    local_108.lookupBias.m_data[0] = (float)local_138[0];
    local_108.lookupBias.m_data[3] = (float)local_138[3];
    local_108.lookupBias.m_data[2] = (float)local_138[2];
    local_108.description._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_replace((ulong)&local_108.description,0,(char *)0x0,0x1c9dbe9);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
    ::push_back(&this->m_iterations,&local_108);
  }
  else if ((TVar2 & ~TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) == TEXTURECHANNELCLASS_SIGNED_INTEGER
          ) {
    tcu::getTextureFormatBitDepth((tcu *)local_138,&local_80);
    uVar7 = -1 << ((byte)local_138[3] - 1 & 0x1f);
    uStack_84 = 0x80000000;
    if (local_138[3] < 0x20) {
      uStack_84 = uVar7;
    }
    if (local_138[3] == 0) {
      uStack_84 = 0;
    }
    uVar9 = -1 << ((byte)local_138[2] - 1 & 0x1f);
    uStack_88 = 0x80000000;
    if (local_138[2] < 0x20) {
      uStack_88 = uVar9;
    }
    if (local_138[2] == 0) {
      uStack_88 = 0;
    }
    fVar11 = (float)(-1 << ((byte)local_138[1] - 1 & 0x1f));
    fStack_8c = -0.0;
    if (local_138[1] < 0x20) {
      fStack_8c = fVar11;
    }
    if (local_138[1] == 0) {
      fStack_8c = 0.0;
    }
    uVar10 = -1 << ((byte)local_138[0] - 1 & 0x1f);
    local_90 = 0x80000000;
    if (local_138[0] < 0x20) {
      local_90 = uVar10;
    }
    if (local_138[0] == 0) {
      local_90 = 0;
    }
    TVar2 = (this->super_TextureBorderClampTest).m_channelClass;
    bVar4 = TVar2 != TEXTURECHANNELCLASS_SIGNED_INTEGER;
    if (bVar4) {
      local_90 = 0;
    }
    if (bVar4) {
      fStack_8c = 0.0;
    }
    if (bVar4) {
      uStack_88 = 0;
      uStack_84 = 0;
    }
    local_58.m_data[0] = 0.0;
    if (local_138[0] != 0) {
      if (TVar2 == TEXTURECHANNELCLASS_SIGNED_INTEGER) {
        local_58.m_data[0] = NAN;
        if (local_138[0] < 0x20) {
          local_58.m_data[0] = (float)~uVar10;
        }
      }
      else {
        local_58.m_data[0] = (float)~(-1 << ((byte)local_138[0] & 0x1f));
        if (0x1f < local_138[0]) {
          local_58.m_data[0] = -NAN;
        }
      }
    }
    local_58.m_data[1] = 0.0;
    if (local_138[1] != 0) {
      if (TVar2 == TEXTURECHANNELCLASS_SIGNED_INTEGER) {
        local_58.m_data[1] = NAN;
        if (local_138[1] < 0x20) {
          local_58.m_data[1] = (float)~(uint)fVar11;
        }
      }
      else {
        local_58.m_data[1] = (float)~(-1 << ((byte)local_138[1] & 0x1f));
        if (0x1f < local_138[1]) {
          local_58.m_data[1] = -NAN;
        }
      }
    }
    local_58.m_data[2] = 0.0;
    if (local_138[2] != 0) {
      if (TVar2 == TEXTURECHANNELCLASS_SIGNED_INTEGER) {
        local_58.m_data[2] = NAN;
        if (local_138[2] < 0x20) {
          local_58.m_data[2] = (float)~uVar9;
        }
      }
      else {
        local_58.m_data[2] = (float)~(-1 << ((byte)local_138[2] & 0x1f));
        if (0x1f < local_138[2]) {
          local_58.m_data[2] = -NAN;
        }
      }
    }
    local_58.m_data[3] = 0.0;
    if (local_138[3] != 0) {
      if (TVar2 == TEXTURECHANNELCLASS_SIGNED_INTEGER) {
        local_58.m_data[3] = NAN;
        if (local_138[3] < 0x20) {
          local_58.m_data[3] = (float)~uVar7;
        }
      }
      else {
        local_58.m_data[3] = (float)~(-1 << ((byte)local_138[3] & 0x1f));
        if (0x1f < local_138[3]) {
          local_58.m_data[3] = -NAN;
        }
      }
    }
    local_48[0] = 0;
    local_48[1] = 0;
    local_48[2] = 0;
    local_48[3] = 0;
    lVar5 = 0;
    do {
      local_48[lVar5] = (int)local_58.m_data[lVar5] - (&local_90)[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    local_68[0] = local_48[0] + (uint)(local_48[0] == 0);
    local_68[1] = local_48[1] + (uint)(local_48[1] == 0);
    local_68[2] = local_48[2] + (uint)(local_48[2] == 0);
    local_68[3] = local_48[3] + (uint)(local_48[3] == 0);
    lVar5 = 0;
    do {
      local_108.p0.m_data[lVar5] = 1.4013e-45;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    local_118 = (anon_union_16_3_1194ccdc_for_v)ZEXT816(0);
    lVar5 = 0;
    do {
      *(int *)((long)&local_118 + lVar5 * 4) =
           (int)local_108.p0.m_data[lVar5] + (int)local_58.m_data[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    paVar1 = &local_108.description.field_2;
    local_108.description._M_string_length = 0;
    local_108.description.field_2._M_local_buf[0] = '\0';
    local_108.p0.m_data[0] = -1.2;
    local_108.p0.m_data[1] = -3.0;
    local_108.p1.m_data[0] = 1.2;
    local_108.p1.m_data[1] = 2.5;
    local_108.borderColor.v = local_118;
    lVar5 = 0;
    do {
      afStack_78[lVar5] = 0.5;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    local_128[0] = 0.0;
    local_128[1] = 0.0;
    local_128[2] = 0.0;
    local_128[3] = 0.0;
    lVar5 = 0;
    do {
      local_128[lVar5] = (float)local_68[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    local_148 = 0;
    uStack_140 = 0;
    lVar5 = 0;
    do {
      *(float *)((long)&local_148 + lVar5 * 4) = afStack_78[lVar5] / local_128[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    local_108.lookupScale.m_data[2] = (float)(undefined4)uStack_140;
    local_108.lookupScale.m_data[3] = (float)uStack_140._4_4_;
    local_108.lookupScale.m_data[0] = (float)(undefined4)local_148;
    local_108.lookupScale.m_data[1] = (float)local_148._4_4_;
    lVar5 = 0;
    if (TVar2 == TEXTURECHANNELCLASS_SIGNED_INTEGER) {
      do {
        *(undefined4 *)((long)&local_148 + lVar5 * 4) = 0x3f000000;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 4);
    }
    else {
      do {
        *(undefined4 *)((long)&local_148 + lVar5 * 4) = 0x3e800000;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 4);
    }
    local_108.lookupBias.m_data[2] = (float)(undefined4)uStack_140;
    local_108.lookupBias.m_data[3] = (float)uStack_140._4_4_;
    local_108.lookupBias.m_data[0] = (float)(undefined4)local_148;
    local_108.lookupBias.m_data[1] = (float)local_148._4_4_;
    local_108.description._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_replace((ulong)&local_108.description,0,(char *)0x0,0x1c9dc08);
    this_00 = &this->m_iterations;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
    ::push_back(this_00,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108.description._M_dataplus._M_p != paVar1) {
      operator_delete(local_108.description._M_dataplus._M_p,
                      CONCAT71(local_108.description.field_2._M_allocated_capacity._1_7_,
                               local_108.description.field_2._M_local_buf[0]) + 1);
    }
    if (TVar2 == TEXTURECHANNELCLASS_SIGNED_INTEGER) {
      lVar5 = 0;
      do {
        local_108.p0.m_data[lVar5] = 1.4013e-45;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 4);
      local_118 = (anon_union_16_3_1194ccdc_for_v)0x0;
      lVar5 = 0;
      do {
        *(uint *)((long)&local_118 + lVar5 * 4) =
             (&local_90)[lVar5] - (int)local_108.p0.m_data[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 4);
      local_108.description._M_string_length = 0;
      local_108.description.field_2._M_local_buf[0] = '\0';
      local_108.p0.m_data[0] = -0.25;
      local_108.p0.m_data[1] = -0.75;
      local_108.p1.m_data[0] = 2.25;
      local_108.p1.m_data[1] = 1.25;
      local_108.borderColor.v = local_118;
      lVar5 = 0;
      do {
        afStack_78[lVar5] = 0.5;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 4);
      local_128[0] = 0.0;
      local_128[1] = 0.0;
      local_128[2] = 0.0;
      local_128[3] = 0.0;
      lVar5 = 0;
      do {
        local_128[lVar5] = (float)local_68[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 4);
      local_148 = 0;
      uStack_140 = 0;
      lVar5 = 0;
      do {
        *(float *)((long)&local_148 + lVar5 * 4) = afStack_78[lVar5] / local_128[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 4);
      local_108.lookupScale.m_data[2] = (float)(undefined4)uStack_140;
      local_108.lookupScale.m_data[3] = (float)uStack_140._4_4_;
      local_108.lookupScale.m_data[0] = (float)(undefined4)local_148;
      local_108.lookupScale.m_data[1] = (float)local_148._4_4_;
      lVar5 = 0;
      do {
        *(undefined4 *)((long)&local_148 + lVar5 * 4) = 0x3f000000;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 4);
      local_108.lookupBias.m_data[2] = (float)(undefined4)uStack_140;
      local_108.lookupBias.m_data[3] = (float)uStack_140._4_4_;
      local_108.lookupBias.m_data[0] = (float)(undefined4)local_148;
      local_108.lookupBias.m_data[1] = (float)local_148._4_4_;
      local_108.description._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_replace((ulong)&local_108.description,0,(char *)0x0,0x1c9dc2e);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
      ::push_back(this_00,&local_108);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108.description._M_dataplus._M_p != paVar1) {
        operator_delete(local_108.description._M_dataplus._M_p,
                        CONCAT71(local_108.description.field_2._M_allocated_capacity._1_7_,
                                 local_108.description.field_2._M_local_buf[0]) + 1);
      }
      lVar5 = 0;
      do {
        *(undefined4 *)((long)&local_118 + lVar5 * 4) = 0x7fffffff;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 4);
    }
    else {
      local_118.uData[2] = 0xffffffff;
      local_118._0_8_ = 0xffffffffffffffff;
      local_118.uData[3] = 0xffffffff;
    }
    local_108.description._M_string_length = 0;
    local_108.description.field_2._M_local_buf[0] = '\0';
    local_108.p0.m_data[0] = -1.6;
    local_108.p0.m_data[1] = -2.1;
    local_108.p1.m_data[0] = 1.2;
    local_108.p1.m_data[1] = 3.5;
    local_108.borderColor.v = local_118;
    lVar5 = 0;
    do {
      afStack_78[lVar5] = 0.5;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    local_128[0] = 0.0;
    local_128[1] = 0.0;
    local_128[2] = 0.0;
    local_128[3] = 0.0;
    lVar5 = 0;
    do {
      local_128[lVar5] = (float)local_68[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    local_148 = 0;
    uStack_140 = 0;
    lVar5 = 0;
    do {
      *(float *)((long)&local_148 + lVar5 * 4) = afStack_78[lVar5] / local_128[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    local_108.lookupScale.m_data[2] = (float)(undefined4)uStack_140;
    local_108.lookupScale.m_data[3] = (float)uStack_140._4_4_;
    local_108.lookupScale.m_data[0] = (float)(undefined4)local_148;
    local_108.lookupScale.m_data[1] = (float)local_148._4_4_;
    lVar5 = 0;
    do {
      *(undefined4 *)((long)&local_148 + lVar5 * 4) = 0x3e800000;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    local_108.lookupBias.m_data[2] = (float)(undefined4)uStack_140;
    local_108.lookupBias.m_data[3] = (float)uStack_140._4_4_;
    local_108.lookupBias.m_data[0] = (float)(undefined4)local_148;
    local_108.lookupBias.m_data[1] = (float)local_148._4_4_;
    local_108.description._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_replace((ulong)&local_108.description,0,(char *)0x0,0x1c9dc52);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
    ::push_back(this_00,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108.description._M_dataplus._M_p != paVar1) {
      operator_delete(local_108.description._M_dataplus._M_p,
                      CONCAT71(local_108.description.field_2._M_allocated_capacity._1_7_,
                               local_108.description.field_2._M_local_buf[0]) + 1);
    }
    if (TVar2 != TEXTURECHANNELCLASS_SIGNED_INTEGER) goto LAB_0151987b;
    lVar5 = 0;
    do {
      *(undefined4 *)((long)&local_118 + lVar5 * 4) = 0x80000000;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    local_108.description._M_string_length = 0;
    local_108.description.field_2._M_local_buf[0] = '\0';
    local_108.p0.m_data[0] = -2.6;
    local_108.p0.m_data[1] = -4.0;
    local_108.p1.m_data[0] = 1.1;
    local_108.p1.m_data[1] = 1.5;
    local_108.borderColor.v = local_118;
    lVar5 = 0;
    do {
      afStack_78[lVar5] = 0.5;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    local_128[0] = 0.0;
    local_128[1] = 0.0;
    local_128[2] = 0.0;
    local_128[3] = 0.0;
    lVar5 = 0;
    do {
      local_128[lVar5] = (float)local_68[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    local_148 = 0;
    uStack_140 = 0;
    lVar5 = 0;
    do {
      *(float *)((long)&local_148 + lVar5 * 4) = afStack_78[lVar5] / local_128[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    local_108.lookupScale.m_data[2] = (float)(undefined4)uStack_140;
    local_108.lookupScale.m_data[3] = (float)uStack_140._4_4_;
    local_108.lookupScale.m_data[0] = (float)(undefined4)local_148;
    local_108.lookupScale.m_data[1] = (float)local_148._4_4_;
    lVar5 = 0;
    do {
      *(undefined4 *)((long)&local_148 + lVar5 * 4) = 0x3e800000;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    local_108.lookupBias.m_data[2] = (float)(undefined4)uStack_140;
    local_108.lookupBias.m_data[3] = (float)uStack_140._4_4_;
    local_108.lookupBias.m_data[0] = (float)(undefined4)local_148;
    local_108.lookupBias.m_data[1] = (float)local_148._4_4_;
    local_108.description._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_replace((ulong)&local_108.description,0,(char *)0x0,0x1c9dc6f);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
    ::push_back(this_00,&local_108);
  }
  else {
    if (TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT < TVar2) goto LAB_0151987b;
    lVar5 = 0;
    if (TVar2 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
      do {
        local_138[lVar5] = 0x3f000000;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 4);
    }
    else {
      do {
        local_138[lVar5] = 0x3e800000;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 4);
    }
    lVar5 = 0;
    if (TVar2 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
      do {
        (&local_90)[lVar5] = 0x3e800000;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 4);
    }
    else {
      do {
        (&local_90)[lVar5] = 0x3f000000;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 4);
    }
    paVar1 = &local_108.description.field_2;
    local_108.lookupBias.m_data = (float  [4])ZEXT816(0);
    local_108.lookupScale.m_data = (float  [4])ZEXT816(0);
    local_108.borderColor.v = (anon_union_16_3_1194ccdc_for_v)ZEXT816(0);
    local_108.description._M_string_length = 0;
    local_108.description.field_2._M_local_buf[0] = '\0';
    local_108.p0.m_data[0] = -1.2;
    local_108.p0.m_data[1] = -3.0;
    local_108.p1.m_data[0] = 1.2;
    local_108.p1.m_data[1] = 2.5;
    local_58.m_data[0] = 1.1;
    local_58.m_data[1] = 1.3;
    local_58.m_data[2] = 2.2;
    local_58.m_data[3] = 1.3;
    local_108.description._M_dataplus._M_p = (pointer)paVar1;
    local_108.borderColor = mapToFormatColorUnits(&local_80,&local_58);
    std::__cxx11::string::_M_replace
              ((ulong)&local_108.description,0,(char *)local_108.description._M_string_length,
               0x1c9dc7f);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
    ::push_back(&this->m_iterations,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108.description._M_dataplus._M_p != paVar1) {
      operator_delete(local_108.description._M_dataplus._M_p,
                      CONCAT71(local_108.description.field_2._M_allocated_capacity._1_7_,
                               local_108.description.field_2._M_local_buf[0]) + 1);
    }
    local_108.lookupBias.m_data[0] = 0.0;
    local_108.lookupBias.m_data[1] = 0.0;
    local_108.lookupBias.m_data[2] = 0.0;
    local_108.lookupBias.m_data[3] = 0.0;
    local_108.lookupScale.m_data[0] = 0.0;
    local_108.lookupScale.m_data[1] = 0.0;
    local_108.lookupScale.m_data[2] = 0.0;
    local_108.lookupScale.m_data[3] = 0.0;
    local_108.borderColor.v = (anon_union_16_3_1194ccdc_for_v)0x0;
    local_108.description._M_string_length = 0;
    local_108.description.field_2._M_local_buf[0] = '\0';
    local_108.p0.m_data[0] = -0.25;
    local_108.p0.m_data[1] = -0.75;
    local_108.p1.m_data[0] = 2.25;
    local_108.p1.m_data[1] = 1.25;
    local_58.m_data[0] = -0.2;
    local_58.m_data[1] = -0.9;
    local_58.m_data[2] = -2.4;
    local_58.m_data[3] = -0.6;
    local_108.description._M_dataplus._M_p = (pointer)paVar1;
    local_108.borderColor = mapToFormatColorUnits(&local_80,&local_58);
    local_108.lookupScale.m_data[1] = fStack_8c;
    local_108.lookupScale.m_data[0] = (float)local_90;
    local_108.lookupScale.m_data[3] = (float)uStack_84;
    local_108.lookupScale.m_data[2] = (float)uStack_88;
    local_108.lookupBias.m_data[1] = (float)local_138[1];
    local_108.lookupBias.m_data[0] = (float)local_138[0];
    local_108.lookupBias.m_data[3] = (float)local_138[3];
    local_108.lookupBias.m_data[2] = (float)local_138[2];
    std::__cxx11::string::_M_replace
              ((ulong)&local_108.description,0,(char *)local_108.description._M_string_length,
               0x1c9dca1);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
    ::push_back(&this->m_iterations,&local_108);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.description._M_dataplus._M_p != &local_108.description.field_2) {
    operator_delete(local_108.description._M_dataplus._M_p,
                    CONCAT71(local_108.description.field_2._M_allocated_capacity._1_7_,
                             local_108.description.field_2._M_local_buf[0]) + 1);
  }
LAB_0151987b:
  pIVar6 = (this->m_iterations).
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar7 = (int)((long)(this->m_iterations).
                      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar6 >> 3) * -0x11111111;
  if (0 < (int)uVar7) {
    dVar3 = this->m_filter;
    uVar8 = (ulong)(uVar7 & 0x7fffffff);
    pIVar6 = (pointer)&pIVar6->compareRef;
    do {
      pIVar6[-1].magFilter = dVar3;
      *(deUint32 *)&pIVar6[-1].description._M_dataplus._M_p = dVar3;
      pIVar6[-1].tWrapMode = 0x812d;
      pIVar6[-1].compareMode = 0x812d;
      *(undefined8 *)&pIVar6[-1].compareRef = 0;
      pIVar6 = pIVar6 + 1;
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
  }
  return (int)pIVar6;
}

Assistant:

void TextureBorderClampRangeClampCase::init (void)
{
	TextureBorderClampTest::init();

	const tcu::TextureFormat	texFormat		= tcu::getEffectiveDepthStencilTextureFormat(getTexture()->getRefTexture().getFormat(), m_sampleMode);
	const bool					isDepth			= isDepthFormat(m_texFormat, m_sampleMode);
	const bool					isFloat			= m_channelClass == tcu::TEXTURECHANNELCLASS_FLOATING_POINT;
	const bool					isFixed			= m_channelClass == tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT || m_channelClass == tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT;
	const bool					isPureInteger	= m_channelClass == tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER || m_channelClass == tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER;

	if (isDepth || isFloat)
	{
		// infinities are commonly used values on depth/float borders
		{
			IterationConfig iteration;
			iteration.p0			= tcu::Vec2(-1.2f, -3.0f);
			iteration.p1			= tcu::Vec2( 1.2f,  2.5f);
			iteration.borderColor	= rr::GenericVec4(tcu::Vec4(std::numeric_limits<float>::infinity()));
			iteration.lookupScale	= tcu::Vec4(0.5f); // scale & bias to [0.25, 0.5] range to make out-of-range values visible
			iteration.lookupBias	= tcu::Vec4(0.25f);
			iteration.description	= "border value infinity";
			m_iterations.push_back(iteration);
		}
		{
			IterationConfig iteration;
			iteration.p0			= tcu::Vec2(-0.25f, -0.75f);
			iteration.p1			= tcu::Vec2( 2.25f,  1.25f);
			iteration.borderColor	= rr::GenericVec4(tcu::Vec4(-std::numeric_limits<float>::infinity()));
			iteration.lookupScale	= tcu::Vec4(0.5f);
			iteration.lookupBias	= tcu::Vec4(0.25f);
			iteration.description	= "border value negative infinity";
			m_iterations.push_back(iteration);
		}
	}
	else if (isPureInteger)
	{
		const tcu::IVec4			numBits		= tcu::getTextureFormatBitDepth(texFormat);
		const bool					isSigned	= m_channelClass == tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER;

		// can't overflow 32bit integers with 32bit integers
		for (int ndx = 0; ndx < 4; ++ndx)
			DE_ASSERT(numBits[ndx] == 0 || numBits[ndx] == 8 || numBits[ndx] == 16);

		const tcu::IVec4	minValue		= getNBitIntegerVec4MinValue(isSigned, numBits);
		const tcu::IVec4	maxValue		= getNBitIntegerVec4MaxValue(isSigned, numBits);
		const tcu::IVec4	valueRange		= maxValue - minValue;
		const tcu::IVec4	divSafeRange	((valueRange[0]==0) ? (1) : (valueRange[0]),
											 (valueRange[1]==0) ? (1) : (valueRange[1]),
											 (valueRange[2]==0) ? (1) : (valueRange[2]),
											 (valueRange[3]==0) ? (1) : (valueRange[3]));

		// format max
		{
			const tcu::IVec4 value = maxValue + tcu::IVec4(1);

			IterationConfig iteration;
			iteration.p0			= tcu::Vec2(-1.2f, -3.0f);
			iteration.p1			= tcu::Vec2( 1.2f,  2.5f);
			iteration.borderColor	= (isSigned) ? (rr::GenericVec4(value)) : (rr::GenericVec4(value.cast<deUint32>()));
			iteration.lookupScale	= tcu::Vec4(0.5f) / divSafeRange.cast<float>();
			iteration.lookupBias	= (isSigned) ? (tcu::Vec4(0.5f)) : (tcu::Vec4(0.25f));
			iteration.description	= "border values one larger than maximum";
			m_iterations.push_back(iteration);
		}
		// format min
		if (isSigned)
		{
			const tcu::IVec4 value = minValue - tcu::IVec4(1);

			IterationConfig iteration;
			iteration.p0			= tcu::Vec2(-0.25f, -0.75f);
			iteration.p1			= tcu::Vec2( 2.25f,  1.25f);
			iteration.borderColor	= rr::GenericVec4(value);
			iteration.lookupScale	= tcu::Vec4(0.5f) / divSafeRange.cast<float>();
			iteration.lookupBias	= tcu::Vec4(0.5f);
			iteration.description	= "border values one less than minimum";
			m_iterations.push_back(iteration);
		}
		// (u)int32 max
		{
			const tcu::IVec4 value = (isSigned) ? (tcu::IVec4(std::numeric_limits<deInt32>::max())) : (tcu::IVec4(std::numeric_limits<deUint32>::max()));

			IterationConfig iteration;
			iteration.p0			= tcu::Vec2(-1.6f, -2.1f);
			iteration.p1			= tcu::Vec2( 1.2f,  3.5f);
			iteration.borderColor	= (isSigned) ? (rr::GenericVec4(value)) : (rr::GenericVec4(value.cast<deUint32>()));
			iteration.lookupScale	= tcu::Vec4(0.5f) / divSafeRange.cast<float>();
			iteration.lookupBias	= tcu::Vec4(0.25f);
			iteration.description	= "border values 32-bit maximum";
			m_iterations.push_back(iteration);
		}
		// int32 min
		if (isSigned)
		{
			const tcu::IVec4 value = tcu::IVec4(std::numeric_limits<deInt32>::min());

			IterationConfig iteration;
			iteration.p0			= tcu::Vec2(-2.6f, -4.0f);
			iteration.p1			= tcu::Vec2( 1.1f,  1.5f);
			iteration.borderColor	= rr::GenericVec4(value);
			iteration.lookupScale	= tcu::Vec4(0.5f) / divSafeRange.cast<float>();
			iteration.lookupBias	= tcu::Vec4(0.25f);
			iteration.description	= "border values 0";
			m_iterations.push_back(iteration);
		}
	}
	else if (isFixed)
	{
		const bool		isSigned	= m_channelClass == tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT;;
		const tcu::Vec4	lookupBias	= (isSigned) ? (tcu::Vec4(0.5f))    : (tcu::Vec4(0.25f)); // scale & bias to [0.25, 0.5] range to make out-of-range values visible
		const tcu::Vec4	lookupScale	= (isSigned) ? (tcu::Vec4(0.25f))   : (tcu::Vec4(0.5f));

		{
			IterationConfig iteration;
			iteration.p0			= tcu::Vec2(-1.2f, -3.0f);
			iteration.p1			= tcu::Vec2( 1.2f,  2.5f);
			iteration.borderColor	= mapToFormatColorUnits(texFormat, tcu::Vec4(1.1f, 1.3f, 2.2f, 1.3f));
			iteration.lookupScale	= lookupScale;
			iteration.lookupBias	= lookupBias;
			iteration.description	= "border values larger than maximum";
			m_iterations.push_back(iteration);
		}
		{
			IterationConfig iteration;
			iteration.p0			= tcu::Vec2(-0.25f, -0.75f);
			iteration.p1			= tcu::Vec2( 2.25f,  1.25f);
			iteration.borderColor	= mapToFormatColorUnits(texFormat, tcu::Vec4(-0.2f, -0.9f, -2.4f, -0.6f));
			iteration.lookupScale	= lookupScale;
			iteration.lookupBias	= lookupBias;
			iteration.description	= "border values less than minimum";
			m_iterations.push_back(iteration);
		}
	}
	else
		DE_ASSERT(false);

	// common parameters
	for (int ndx = 0; ndx < (int)m_iterations.size(); ++ndx)
	{
		IterationConfig& iteration = m_iterations[ndx];

		iteration.minFilter		= m_filter;
		iteration.magFilter		= m_filter;
		iteration.sWrapMode		= GL_CLAMP_TO_BORDER;
		iteration.tWrapMode		= GL_CLAMP_TO_BORDER;
		iteration.compareMode	= GL_NONE;
		iteration.compareRef	= 0.0f;
	}
}